

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dosbox_opl3.cpp
# Opt level: O1

void __thiscall DosBoxOPL3::DosBoxOPL3(DosBoxOPL3 *this)

{
  Chip *this_00;
  
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  super_OPLChipBase.m_id = 0;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  super_OPLChipBase.m_rate = 0xac44;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  m_runningAtPcmRate = false;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_oldsamples
  [0] = 0;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_oldsamples
  [1] = 0;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[0] =
       0;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[1] =
       0;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samplecnt =
       0;
  *(undefined8 *)
   &(this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_rateratio
       = 0x38c;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  super_OPLChipBase._vptr_OPLChipBase = (_func_int **)&PTR__DosBoxOPL3_0021d180;
  this_00 = (Chip *)operator_new(0x11b0);
  DBOPL::Chip::Chip(this_00);
  this->m_chip = this_00;
  reset(this);
  return;
}

Assistant:

DosBoxOPL3::DosBoxOPL3() :
    OPLChipBaseBufferedT(),
    m_chip(new DBOPL::Handler)
{
    DosBoxOPL3::reset();
}